

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NodeIsMuxControlType(Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x579,"int Abc_NodeIsMuxControlType(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjFanoutNum(pNode);
  if (iVar1 == 2) {
    pAVar2 = Abc_ObjFanout(pNode,0);
    pAVar3 = Abc_ObjFanout(pNode,1);
    iVar1 = Abc_ObjFanoutNum(pAVar2);
    if ((iVar1 == 1) && (iVar1 = Abc_ObjFanoutNum(pAVar3), iVar1 == 1)) {
      pAVar2 = Abc_ObjFanout0(pAVar2);
      pAVar3 = Abc_ObjFanout0(pAVar3);
      return (uint)(pAVar2 == pAVar3);
    }
  }
  return 0;
}

Assistant:

int Abc_NodeIsMuxControlType( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Abc_ObjIsComplement(pNode) );
    // skip the node that do not have two fanouts
    if ( Abc_ObjFanoutNum(pNode) != 2 )
        return 0;
    // get the fanouts
    pNode0 = Abc_ObjFanout( pNode, 0 );
    pNode1 = Abc_ObjFanout( pNode, 1 );
    // if they have more than one fanout, we are not interested
    if ( Abc_ObjFanoutNum(pNode0) != 1 ||  Abc_ObjFanoutNum(pNode1) != 1 )
        return 0;
    // if the fanouts have the same fanout, this is MUX or EXOR (or a redundant gate (CA)(CB))
    return Abc_ObjFanout0(pNode0) == Abc_ObjFanout0(pNode1);
}